

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd.cpp
# Opt level: O2

void __thiscall
bp_osd::bp_osd(bp_osd *this,mod2sparse *H,double channel_prob,int max_iter,double osd_order,
              int osd_method,int bp_method)

{
  int iVar1;
  char *pcVar2;
  double *__s;
  int *piVar3;
  char **ppcVar4;
  unsigned_long_long uVar5;
  ostream *poVar6;
  int j;
  ulong uVar7;
  int i_1;
  int iVar8;
  int i_2;
  int i;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  double dVar12;
  
  this->H = H;
  iVar8 = H->n_cols;
  this->M = H->n_rows;
  this->N = iVar8;
  iVar1 = mod2sparse_rank(H);
  this->rank = iVar1;
  iVar8 = this->N;
  uVar10 = (ulong)iVar8;
  this->K = iVar8 - iVar1;
  this->channel_prob = channel_prob;
  if ((max_iter == 0) || (iVar8 < max_iter)) {
    this->max_iter = iVar8;
  }
  else {
    this->max_iter = max_iter;
  }
  this->bp_method = bp_method;
  iVar1 = (int)osd_order;
  this->osd_order = iVar1;
  this->osd_method = osd_method;
  pcVar2 = (char *)operator_new__(uVar10);
  memset(pcVar2,0,uVar10);
  this->bp_decoding = pcVar2;
  pcVar2 = (char *)operator_new__(uVar10);
  memset(pcVar2,0,uVar10);
  this->osd0_decoding = pcVar2;
  pcVar2 = (char *)operator_new__(uVar10);
  memset(pcVar2,0,uVar10);
  this->osdw_decoding = pcVar2;
  uVar10 = uVar10 << 3;
  if (iVar8 < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  __s = (double *)operator_new__(uVar10);
  memset(__s,0,uVar10);
  this->log_prob_ratios = __s;
  piVar3 = (int *)operator_new__(4);
  *piVar3 = 0;
  this->converge = piVar3;
  piVar3 = (int *)operator_new__(4);
  *piVar3 = 0;
  this->iter = piVar3;
  switch(osd_method) {
  case 0:
    dVar12 = exp2(osd_order);
    uVar11 = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
    this->encoding_input_count = uVar11;
    ppcVar4 = (char **)operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar11 * 8);
    this->osd_w_encoding_inputs = ppcVar4;
    for (uVar10 = 0; uVar10 < uVar11; uVar10 = uVar10 + 1) {
      pcVar2 = decimal_to_binary_reverse((int)uVar10,this->N - this->rank);
      this->osd_w_encoding_inputs[uVar10] = pcVar2;
      uVar11 = this->encoding_input_count;
    }
    break;
  case 1:
    uVar5 = ncr(iVar1,2);
    iVar8 = this->K;
    iVar1 = (int)uVar5 + iVar8;
    this->encoding_input_count = (long)iVar1;
    uVar10 = (long)iVar1 * 8;
    if (iVar1 < 0) {
      uVar10 = 0xffffffffffffffff;
    }
    ppcVar4 = (char **)operator_new__(uVar10);
    this->osd_w_encoding_inputs = ppcVar4;
    for (uVar10 = 0; uVar9 = (ulong)iVar8, (long)uVar10 < (long)uVar9; uVar10 = uVar10 + 1) {
      pcVar2 = (char *)operator_new__(uVar9);
      memset(pcVar2,0,uVar9);
      this->osd_w_encoding_inputs[uVar10] = pcVar2;
      this->osd_w_encoding_inputs[uVar10][uVar10] = '\x01';
      iVar8 = this->K;
    }
    for (uVar9 = 0; (double)(int)uVar9 < osd_order; uVar9 = uVar9 + 1) {
      for (uVar7 = 0; (double)(int)uVar7 < osd_order; uVar7 = uVar7 + 1) {
        if (uVar9 < uVar7) {
          iVar8 = this->K;
          pcVar2 = (char *)operator_new__((long)iVar8);
          memset(pcVar2,0,(long)iVar8);
          iVar8 = (int)uVar10;
          this->osd_w_encoding_inputs[iVar8] = pcVar2;
          this->osd_w_encoding_inputs[iVar8][uVar9] = '\x01';
          this->osd_w_encoding_inputs[iVar8][uVar7] = '\x01';
          uVar10 = (ulong)(iVar8 + 1);
        }
      }
    }
    break;
  case 2:
    break;
  case 3:
    uVar5 = ncr(iVar1,2);
    this->encoding_input_count = (long)(int)uVar5 + (long)this->K;
    break;
  default:
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "ERROR. Function <bp_osd::constructor>. OSD Method ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,osd_method);
    poVar6 = std::operator<<(poVar6," not valid");
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(0x16);
  }
  return;
}

Assistant:

bp_osd::bp_osd(mod2sparse *H, double channel_prob, int max_iter, double osd_order,int osd_method, int bp_method){

    this->H=H;
    this->N=mod2sparse_cols(H);
    this->M=mod2sparse_rows(H);

    this->rank=mod2sparse_rank(H);
    this->K=N-rank;

    this->channel_prob=channel_prob;

    if(max_iter==0){this->max_iter=N;}
    else if(max_iter>N){this->max_iter=N;}
    else{this->max_iter=max_iter;}

    this->bp_method=bp_method;

    this->osd_order=osd_order;
    this->osd_method=osd_method;
    this->bp_decoding=new char[N]();
    this->osd0_decoding=new char[N]();
    this->osdw_decoding=new char[N]();
    this->log_prob_ratios=new double[N]();
    this->converge=new int[1]();
    this->iter=new int[1]();

    if(osd_method==0) {
        assert(osd_order<=N-rank);
        this->encoding_input_count=pow(2,osd_order);
        this->osd_w_encoding_inputs = new char*[encoding_input_count];
        for(int i = 0; i < encoding_input_count; ++i)
            osd_w_encoding_inputs[i] = decimal_to_binary_reverse(i, N - rank);
        }
    else if(osd_method==1){
        assert(osd_order<=K);
        int total_count=0;
        int w2_count=ncr(osd_order,2);
        this->encoding_input_count = K+w2_count;

        this->osd_w_encoding_inputs = new char*[encoding_input_count];
        for(int i=0;i<K;i++){
            osd_w_encoding_inputs[total_count]=new char[K]();
            osd_w_encoding_inputs[total_count][i]=1;
            total_count++;
        }
        for(int i=0;i<osd_order;i++){
            for(int j=0;j<osd_order;j++){
                if(i<j){
                    osd_w_encoding_inputs[total_count]=new char[K]();
                    osd_w_encoding_inputs[total_count][i]=1;
                    osd_w_encoding_inputs[total_count][j]=1;
                    total_count++;
                }
            }
        }
        assert(total_count==this->encoding_input_count);

    }
    else if(osd_method==2) 1;
    else if(osd_method==3){
        assert(osd_order<=K);
        int w2_count=ncr(osd_order,2);
        this->encoding_input_count = K+w2_count;
    }

    else{
        cout<<"ERROR. Function <bp_osd::constructor>. OSD Method "<<osd_method<< " not valid"<<endl;
        exit(22);
    }

}